

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

bool __thiscall OpenGliderConnection::APRSSendKeepAlive(OpenGliderConnection *this)

{
  time_t t;
  ssize_t sVar1;
  size_t __n;
  void *__buf;
  int __flags;
  string local_a8;
  char sKeepAlive [120];
  
  t = time((time_t *)0x0);
  ts2string_abi_cxx11_(&local_a8,t);
  __flags = (int)local_a8._M_dataplus._M_p;
  snprintf(sKeepAlive,0x78,"# LiveTraffic %s still alive at %sZ\r\n");
  std::__cxx11::string::~string((string *)&local_a8);
  if ((int)dataRefs.iLogLevel < 1) {
    __flags = 0x23dd2f;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
           ,0x218,"APRSSendKeepAlive",logDEBUG,"OGN: Sending keep alive: %s",sKeepAlive);
  }
  __n = 1;
  LTOnlineChannel::DebugLogRaw((LTOnlineChannel *)this,sKeepAlive,-1,true);
  sVar1 = XPMP2::TCPConnection::send(&this->tcpAprs,(int)sKeepAlive,__buf,__n,__flags);
  return SUB81(sVar1,0);
}

Assistant:

bool OpenGliderConnection::APRSSendKeepAlive()
{
    // Prepare login string like "user LiveTrffc pass -1 vers LiveTraffic 2.20 filter r/43.3/-80.2/50 -p/oimqstunw"
    char sKeepAlive[120];
    snprintf(sKeepAlive, sizeof(sKeepAlive), OGN_APRS_KEEP_ALIVE, LT_VERSION,
             ts2string(time(nullptr)).c_str());
    LOG_MSG(logDEBUG, "OGN: Sending keep alive: %s", sKeepAlive);
    DebugLogRaw(sKeepAlive, HTTP_FLAG_SENDING);
    return tcpAprs.send(sKeepAlive);
}